

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O0

string * encode_abi_cxx11_(string_view str2encode)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_RDI;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_59 [9];
  size_t in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (allocator<char> *)in_stack_ffffffffffffff80);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  gmlc::utilities::base64_encode_abi_cxx11_(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char)((ulong)this >> 0x38));
  std::__cxx11::string::~string(this);
  std::__cxx11::string::~string(this);
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator(local_59);
  return in_RDI;
}

Assistant:

static std::string encode(std::string_view str2encode)
{
    return std::string("b64[") +
        gmlc::utilities::base64_encode(reinterpret_cast<const unsigned char*>(str2encode.data()),
                                       static_cast<int>(str2encode.size())) +
        ']';
}